

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

Value * __thiscall
anon_unknown.dwarf_caa9d4::CodemodelConfig::Dump
          (Value *__return_storage_ptr__,CodemodelConfig *this)

{
  _Rb_tree_header *p_Var1;
  pointer *ppDVar2;
  pointer *ppPVar3;
  undefined8 *puVar4;
  cmStateSnapshot *pcVar5;
  undefined8 *puVar6;
  uint uVar7;
  pointer pDVar8;
  cmMakefile *pcVar9;
  pointer ppcVar10;
  pointer ppcVar11;
  pointer pcVar12;
  cmFileAPI *this_00;
  pointer pPVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  cmState *pcVar17;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar18;
  pointer pPVar19;
  pointer pPVar20;
  bool bVar21;
  int iVar22;
  TargetType TVar23;
  ArrayIndex AVar24;
  Value *pVVar25;
  pointer pDVar26;
  _Base_ptr p_Var27;
  ValueHolder *pVVar28;
  pointer pDVar29;
  mapped_type_conflict1 *pmVar30;
  iterator iVar31;
  ulong uVar32;
  pointer pPVar33;
  ulong uVar34;
  cmGlobalGenerator *pcVar35;
  string *psVar36;
  cmLocalGenerator *pcVar37;
  _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
  *this_01;
  pointer pPVar38;
  ValueHolder *pVVar39;
  long lVar40;
  ValueHolder VVar41;
  pointer pPVar42;
  pointer pDVar43;
  pointer ppcVar44;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  __i;
  pointer pDVar45;
  pointer ppcVar46;
  ValueHolder VVar47;
  long lVar48;
  bool bVar49;
  cmStateSnapshot ps;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targetList;
  Value childIndexes;
  string sourceDir;
  string prefix;
  string buildDir;
  Target t;
  cmStateSnapshot parentDir;
  ValueHolder local_678;
  ValueHolder VStack_670;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_668;
  ValueHolder *local_650;
  Value *local_648;
  pointer local_640;
  map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
  *local_638;
  _Base_ptr local_630;
  ValueHolder local_628;
  ValueHolder *pVStack_620;
  long local_618;
  _Base_ptr local_600;
  ValueHolder local_5f8;
  ValueHolder VStack_5f0;
  ValueHolder local_5e8;
  ValueHolder local_5c8;
  undefined8 uStack_5c0;
  CommentInfo local_5b8 [3];
  char *local_5a0;
  ulong local_598;
  _Base_ptr local_590;
  ValueHolder local_588;
  undefined8 uStack_580;
  char *local_578;
  ValueHolder local_560;
  cmStateSnapshot *local_558;
  long local_550;
  string local_538;
  Value local_518;
  ValueHolder local_4f0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0;
  string local_4c8;
  string local_4a8;
  ValueHolder local_488;
  ValueHolder VStack_480;
  ValueHolder local_478;
  allocator_type *local_458;
  ulong local_450;
  long local_448;
  map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
  *local_440;
  Value local_438;
  undefined1 local_410 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  Value local_3f0;
  ValueHolder local_3c8;
  ValueHolder VStack_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  undefined1 local_3a8 [16];
  char *local_398 [2];
  char local_388 [16];
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> local_378;
  ValueHolder local_360;
  ValueHolder local_358;
  ValueHolder local_350;
  undefined8 uStack_348;
  _Base_ptr *local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined4 local_320;
  undefined8 local_318;
  _Base_ptr p_Stack_310;
  undefined8 *local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined4 local_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  _Base_ptr *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined4 local_2b0;
  undefined8 local_2a8;
  _Base_ptr p_Stack_2a0;
  Value local_298;
  Value local_270;
  Value local_248;
  _Rb_tree_node_base local_218;
  undefined8 local_1f8;
  _Base_ptr *local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined4 local_1d0;
  undefined8 local_1c8;
  _Base_ptr p_Stack_1c0;
  Value local_1b8;
  _Base_ptr *local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined4 local_170;
  undefined8 local_168;
  _Base_ptr p_Stack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  _Rb_tree_node_base local_138;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  Value local_f8;
  Value local_d0;
  ValueHolder local_a8;
  ValueHolder VStack_a0;
  ValueHolder local_98;
  ValueHolder local_88;
  ValueHolder VStack_80;
  ValueHolder local_78;
  ValueHolder local_70;
  ValueHolder VStack_68;
  ValueHolder local_60;
  ValueHolder local_58 [5];
  
  local_648 = __return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value((Value *)local_58,this->Config);
  pVVar25 = Json::Value::operator[](local_648,"name");
  pVVar39 = local_58;
  Json::Value::operator=(pVVar25,(Value *)pVVar39);
  Json::Value::~Value((Value *)local_58);
  pVVar28 = (ValueHolder *)this->FileAPI->CMakeInstance->GlobalGenerator;
  this_01 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             *)((long)pVVar28[0x14].string_ - pVVar28[0x13].int_ >> 3);
  if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
       *)0x199999999999999 < this_01) {
    local_5a0 = "vector::reserve";
LAB_002a14ce:
    std::__throw_length_error(local_5a0);
  }
  pDVar43 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
       *)(((long)(this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar43 >> 4) *
         -0x3333333333333333) < this_01) {
    pDVar8 = (this->Directories).
             super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_650 = pVVar28;
    pDVar26 = std::
              _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ::_M_allocate(this_01,(size_t)pVVar39);
    if (pDVar43 != pDVar8) {
      lVar40 = 0;
      do {
        puVar6 = (undefined8 *)((long)&(pDVar43->Snapshot).State + lVar40);
        pVVar39 = (ValueHolder *)(puVar6 + 4);
        uVar14 = *puVar6;
        uVar15 = puVar6[1];
        uVar16 = puVar6[3];
        puVar4 = (undefined8 *)((long)&(pDVar26->Snapshot).Position.Position + lVar40);
        *puVar4 = puVar6[2];
        puVar4[1] = uVar16;
        puVar4 = (undefined8 *)((long)&(pDVar26->Snapshot).State + lVar40);
        *puVar4 = uVar14;
        puVar4[1] = uVar15;
        Json::Value::Value((Value *)((long)&(pDVar26->TargetIndexes).value_ + lVar40),
                           (Value *)pVVar39);
        (&pDVar26->HasInstallRule)[lVar40] = *(bool *)((long)puVar6 + 0x4c);
        *(undefined4 *)((long)&pDVar26->ProjectIndex + lVar40) = *(undefined4 *)(puVar6 + 9);
        lVar40 = lVar40 + 0x50;
      } while ((pointer)(puVar6 + 10) != pDVar8);
    }
    pDVar29 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pDVar45 = (this->Directories).
                   super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                   ._M_impl.super__Vector_impl_data._M_start; pDVar45 != pDVar29;
        pDVar45 = pDVar45 + 1) {
      Json::Value::~Value(&pDVar45->TargetIndexes);
    }
    pDVar45 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pDVar45 != (pointer)0x0) {
      pVVar39 = (ValueHolder *)
                ((long)(this->Directories).
                       super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar45);
      operator_delete(pDVar45,(ulong)pVVar39);
    }
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_start = pDVar26;
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(((long)pDVar8 - (long)pDVar43) + (long)pDVar26);
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar26 + (long)this_01;
    pVVar28 = local_650;
  }
  p_Var27 = (_Base_ptr)pVVar28[0x13].string_;
  local_600 = (_Base_ptr)pVVar28[0x14].int_;
  if (p_Var27 != local_600) {
    local_638 = &this->DirectoryMap;
    local_440 = &this->ProjectMap;
    local_590 = &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_448 = 0x7fffffffffffffd0;
    local_5a0 = "vector::_M_realloc_insert";
    do {
      pcVar37 = *(cmLocalGenerator **)p_Var27;
      pDVar43 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar8 = (this->Directories).
               super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar40 = (long)pDVar8 - (long)pDVar43;
      local_650 = (ValueHolder *)((lVar40 >> 4) * -0x3333333333333333);
      local_630 = p_Var27;
      if (pDVar8 == (this->Directories).
                    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        if (lVar40 == local_448) goto LAB_002a14ce;
        pVVar28 = local_650;
        if (pDVar8 == pDVar43) {
          pVVar28 = (ValueHolder *)0x1;
        }
        local_640 = (pointer)((long)pVVar28 + (long)local_650);
        if ((pointer)0x199999999999998 < local_640) {
          local_640 = (pointer)0x199999999999999;
        }
        if (CARRY8((ulong)pVVar28,(ulong)local_650)) {
          local_640 = (pointer)0x199999999999999;
        }
        pDVar29 = std::
                  _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ::_M_allocate((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                                 *)local_640,(size_t)pVVar39);
        pcVar5 = (cmStateSnapshot *)((long)pDVar29 + lVar40);
        puVar6 = (undefined8 *)((long)&pDVar29->TargetIndexes + lVar40 + 0x20);
        *puVar6 = 0;
        puVar6[1] = 0;
        puVar6 = (undefined8 *)((long)&pDVar29->TargetIndexes + lVar40 + 0x10);
        *puVar6 = 0;
        puVar6[1] = 0;
        puVar6 = (undefined8 *)((long)&pDVar29->TargetIndexes + lVar40);
        *puVar6 = 0;
        puVar6[1] = 0;
        puVar6 = (undefined8 *)((long)&pDVar29->Snapshot + lVar40 + 0x10);
        *puVar6 = 0;
        puVar6[1] = 0;
        *(undefined8 *)((long)pDVar29 + lVar40) = 0;
        ((undefined8 *)((long)pDVar29 + lVar40))[1] = 0;
        cmStateSnapshot::cmStateSnapshot(pcVar5,(cmState *)0x0);
        pcVar5[1].State = (cmState *)0x0;
        Json::Value::Value((Value *)&pcVar5[1].Position,arrayValue);
        *(undefined1 *)((long)&pcVar5[3].State + 4) = 0;
        pDVar26 = pDVar43;
        pDVar45 = pDVar29;
        if (pDVar8 != pDVar43) {
          lVar40 = 0;
          do {
            lVar48 = lVar40;
            puVar6 = (undefined8 *)((long)&(pDVar43->Snapshot).State + lVar48);
            uVar14 = *puVar6;
            uVar15 = puVar6[1];
            uVar16 = puVar6[3];
            puVar4 = (undefined8 *)((long)&(pDVar29->Snapshot).Position.Position + lVar48);
            *puVar4 = puVar6[2];
            puVar4[1] = uVar16;
            puVar4 = (undefined8 *)((long)&(pDVar29->Snapshot).State + lVar48);
            *puVar4 = uVar14;
            puVar4[1] = uVar15;
            Json::Value::Value((Value *)((long)&(pDVar29->TargetIndexes).value_ + lVar48),
                               (Value *)(puVar6 + 4));
            (&pDVar29->HasInstallRule)[lVar48] = *(bool *)((long)puVar6 + 0x4c);
            *(undefined4 *)((long)&pDVar29->ProjectIndex + lVar48) = *(undefined4 *)(puVar6 + 9);
            lVar40 = lVar48 + 0x50;
          } while ((pointer)(puVar6 + 10) != pDVar8);
          pDVar45 = (pointer)((long)&pDVar29[1].Snapshot.State + lVar48);
        }
        for (; pDVar8 != pDVar26; pDVar26 = pDVar26 + 1) {
          Json::Value::~Value(&pDVar26->TargetIndexes);
        }
        if (pDVar43 != (pointer)0x0) {
          operator_delete(pDVar43,(long)(this->Directories).
                                        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pDVar43);
        }
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_start = pDVar29;
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pDVar45 + 0x50);
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar29 + (long)local_640;
      }
      else {
        (pDVar8->TargetIndexes).limit_ = 0;
        pDVar8->ProjectIndex = 0;
        pDVar8->HasInstallRule = false;
        *(undefined3 *)&pDVar8->field_0x4d = 0;
        (pDVar8->TargetIndexes).comments_ = (CommentInfo *)0x0;
        (pDVar8->TargetIndexes).start_ = 0;
        (pDVar8->TargetIndexes).value_.int_ = 0;
        *(undefined8 *)&(pDVar8->TargetIndexes).field_0x8 = 0;
        (pDVar8->Snapshot).Position.Position = 0;
        pDVar8->LocalGenerator = (cmLocalGenerator *)0x0;
        (pDVar8->Snapshot).State = (cmState *)0x0;
        (pDVar8->Snapshot).Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
        cmStateSnapshot::cmStateSnapshot(&pDVar8->Snapshot,(cmState *)0x0);
        pDVar8->LocalGenerator = (cmLocalGenerator *)0x0;
        Json::Value::Value(&pDVar8->TargetIndexes,arrayValue);
        pDVar8->HasInstallRule = false;
        ppDVar2 = &(this->Directories).
                   super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar2 = *ppDVar2 + 1;
      }
      pVVar28 = (ValueHolder *)
                ((this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_start + ((ulong)local_650 & 0xffffffff));
      cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_678,pcVar37);
      cmStateSnapshot::GetBuildsystemDirectory
                ((cmStateSnapshot *)&local_3c8,(cmStateSnapshot *)&local_678);
      pVVar28[2] = (ValueHolder)local_3b8._M_allocated_capacity;
      *pVVar28 = local_3c8;
      pVVar28[1] = VStack_3c0;
      pVVar28[3].map_ = (ObjectValues *)pcVar37;
      pmVar30 = std::
                map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                ::operator[](local_638,(key_type *)pVVar28);
      *pmVar30 = (mapped_type_conflict1)local_650;
      local_5e8 = pVVar28[2];
      local_5f8 = *pVVar28;
      VStack_5f0 = pVVar28[1];
      pVVar39 = &local_5f8;
      local_488 = local_5f8;
      VStack_480 = VStack_5f0;
      local_478 = local_5e8;
      cmStateSnapshot::GetBuildsystemDirectoryParent
                ((cmStateSnapshot *)&local_678,(cmStateSnapshot *)pVVar39);
      bVar21 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_678);
      if (bVar21) {
        cmStateSnapshot::GetProjectName_abi_cxx11_(&local_4c8,(cmStateSnapshot *)&local_678);
        pVVar39 = &local_5f8;
        cmStateSnapshot::GetProjectName_abi_cxx11_((string *)local_410,(cmStateSnapshot *)pVVar39);
        if (local_4c8._M_string_length != local_410._8_8_) goto LAB_0029ff52;
        if (local_4c8._M_string_length == 0) {
          bVar49 = true;
        }
        else {
          pVVar39 = (ValueHolder *)local_410._0_8_;
          iVar22 = bcmp(local_4c8._M_dataplus._M_p,(void *)local_410._0_8_,
                        local_4c8._M_string_length);
          bVar49 = iVar22 == 0;
        }
      }
      else {
LAB_0029ff52:
        bVar49 = false;
      }
      if (bVar21) {
        if ((ValueHolder *)local_410._0_8_ != (ValueHolder *)(local_410 + 0x10)) {
          pVVar39 = (ValueHolder *)(local_400._M_allocated_capacity + 1);
          operator_delete((void *)local_410._0_8_,(ulong)pVVar39);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
          pVVar39 = (ValueHolder *)(local_4c8.field_2._M_allocated_capacity + 1);
          operator_delete(local_4c8._M_dataplus._M_p,(ulong)pVVar39);
        }
      }
      if (bVar49) {
        local_3b8._M_allocated_capacity = local_668._M_allocated_capacity;
        local_3c8 = local_678;
        VStack_3c0 = VStack_670;
        iVar31 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(&local_638->_M_t,(key_type *)&local_3c8);
        if (iVar31._M_node == local_590) goto LAB_002a14a0;
        AVar24 = (this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar31._M_node[1]._M_right].
                 ProjectIndex;
      }
      else {
        pPVar38 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pPVar13 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar40 = (long)pPVar13 - (long)pPVar38 >> 3;
        uVar34 = lVar40 * -0x79435e50d79435e5;
        if (pPVar13 ==
            (this->Projects).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          if ((long)pPVar13 - (long)pPVar38 == 0x7fffffffffffffc8) goto LAB_002a14ce;
          uVar32 = uVar34;
          if (pPVar13 == pPVar38) {
            uVar32 = 1;
          }
          local_598 = uVar32 + uVar34;
          if (0xd79435e50d7942 < local_598) {
            local_598 = 0xd79435e50d7943;
          }
          if (CARRY8(uVar32,uVar34)) {
            local_598 = 0xd79435e50d7943;
          }
          if (local_598 == 0) {
            pPVar33 = (pointer)0x0;
          }
          else {
            pPVar33 = (pointer)operator_new(local_598 * 0x98);
          }
          local_458 = (allocator_type *)(&(pPVar33->Snapshot).State + lVar40);
          local_450 = uVar34;
          std::allocator_traits<std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>::
          construct<(anonymous_namespace)::CodemodelConfig::Project>(local_458,(Project *)pVVar39);
          pPVar19 = pPVar38;
          pPVar42 = pPVar33;
          for (; local_640 = pPVar19, uVar34 = local_450, pPVar20 = pPVar19, pPVar13 != pPVar38;
              pPVar38 = pPVar38 + 1) {
            pcVar17 = (pPVar38->Snapshot).State;
            pcVar18 = (pPVar38->Snapshot).Position.Tree;
            uVar14 = *(undefined8 *)((long)&(pPVar38->Snapshot).Position.Position + 4);
            *(undefined8 *)((long)&(pPVar42->Snapshot).Position.Tree + 4) =
                 *(undefined8 *)((long)&(pPVar38->Snapshot).Position.Tree + 4);
            *(undefined8 *)((long)&(pPVar42->Snapshot).Position.Position + 4) = uVar14;
            (pPVar42->Snapshot).State = pcVar17;
            (pPVar42->Snapshot).Position.Tree = pcVar18;
            Json::Value::Value(&pPVar42->ChildIndexes,&pPVar38->ChildIndexes);
            Json::Value::Value(&pPVar42->DirectoryIndexes,&pPVar38->DirectoryIndexes);
            Json::Value::Value(&pPVar42->TargetIndexes,&pPVar38->TargetIndexes);
            pPVar42 = pPVar42 + 1;
            pPVar19 = local_640;
          }
          for (; local_450 = uVar34, pPVar13 != pPVar20; pPVar20 = pPVar20 + 1) {
            Json::Value::~Value(&pPVar20->TargetIndexes);
            Json::Value::~Value(&pPVar20->DirectoryIndexes);
            Json::Value::~Value(&pPVar20->ChildIndexes);
            uVar34 = local_450;
          }
          if (pPVar19 != (pointer)0x0) {
            operator_delete(pPVar19,(long)(this->Projects).
                                          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)pPVar19);
          }
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_start = pPVar33;
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_finish = pPVar42 + 1;
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar33 + local_598;
        }
        else {
          std::allocator_traits<std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>::
          construct<(anonymous_namespace)::CodemodelConfig::Project>
                    ((allocator_type *)pPVar13,(Project *)pVVar39);
          ppPVar3 = &(this->Projects).
                     super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppPVar3 = *ppPVar3 + 1;
        }
        AVar24 = (ArrayIndex)uVar34;
        uVar34 = uVar34 & 0xffffffff;
        pPVar38 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(ValueHolder *)&pPVar38[uVar34].Snapshot.Position.Position = local_5e8;
        *(ValueHolder *)(pPVar38 + uVar34) = local_5f8;
        ((ValueHolder *)(pPVar38 + uVar34))[1] = VStack_5f0;
        pmVar30 = std::
                  map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                  ::operator[](local_440,(key_type *)&local_5f8);
        *pmVar30 = AVar24;
        bVar21 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_678);
        if (bVar21) {
          local_3b8._M_allocated_capacity = local_668._M_allocated_capacity;
          local_3c8 = local_678;
          VStack_3c0 = VStack_670;
          iVar31 = std::
                   _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                   ::find(&local_638->_M_t,(key_type *)&local_3c8);
          if (iVar31._M_node == local_590) goto LAB_002a14a0;
          uVar7 = (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar31._M_node[1]._M_right].
                  ProjectIndex;
          pPVar38[uVar34].ParentIndex = uVar7;
          pPVar38 = (this->Projects).
                    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          Json::Value::Value((Value *)&local_3c8,AVar24);
          Json::Value::append(&pPVar38[uVar7].ChildIndexes,(Value *)&local_3c8);
          Json::Value::~Value((Value *)&local_3c8);
        }
      }
      *(ArrayIndex *)(pVVar28 + 9) = AVar24;
      pPVar38 = (this->Projects).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                ._M_impl.super__Vector_impl_data._M_start;
      Json::Value::Value((Value *)&local_3c8,(UInt)local_650);
      pVVar39 = &local_3c8;
      Json::Value::append(&pPVar38[AVar24].DirectoryIndexes,(Value *)&local_3c8);
      Json::Value::~Value((Value *)&local_3c8);
      p_Var27 = (_Base_ptr)&local_630->_M_parent;
    } while (p_Var27 != local_600);
  }
  pDVar43 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar43 !=
      (this->Directories).
      super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pcVar9 = (pDVar43[-1].LocalGenerator)->Makefile;
      ppcVar10 = (pcVar9->InstallGenerators).
                 super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar46 = (pcVar9->InstallGenerators).
                      super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppcVar46 != ppcVar10;
          ppcVar46 = ppcVar46 + 1) {
        if ((*ppcVar46 == (cmInstallGenerator *)0x0) ||
           (lVar40 = __dynamic_cast(*ppcVar46,&cmInstallGenerator::typeinfo,
                                    &cmInstallSubdirectoryGenerator::typeinfo,0), lVar40 == 0)) {
          pDVar43[-1].HasInstallRule = true;
          break;
        }
      }
      pDVar8 = pDVar43 + -1;
      if (pDVar43[-1].HasInstallRule == false) {
        cmStateSnapshot::GetChildren
                  ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_678,
                   &pDVar8->Snapshot);
        VVar41 = VStack_670;
        for (VVar47 = local_678; VVar47.int_ != VVar41.int_;
            VVar47.string_ = (char *)((long)&(VVar47.map_)->_M_t + 0x18)) {
          cmStateSnapshot::GetBuildsystemDirectory
                    ((cmStateSnapshot *)&local_5f8,(cmStateSnapshot *)VVar47.map_);
          local_3b8._M_allocated_capacity = (size_type)local_5e8;
          local_3c8 = local_5f8;
          VStack_3c0 = VStack_5f0;
          iVar31 = std::
                   _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                   ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_3c8);
          if ((_Rb_tree_header *)iVar31._M_node ==
              &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header) goto LAB_002a14a0;
          if ((this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar31._M_node[1]._M_right].
              HasInstallRule == true) {
            pDVar43[-1].HasInstallRule = true;
            break;
          }
        }
        if (local_678 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_678.string_,local_668._M_allocated_capacity - (long)local_678);
        }
      }
      pDVar43 = pDVar8;
    } while (pDVar8 != (this->Directories).
                       super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  Json::Value::Value(&local_3f0,arrayValue);
  local_628.int_ = 0;
  pVStack_620 = (ValueHolder *)0x0;
  local_618 = 0;
  pcVar35 = this->FileAPI->CMakeInstance->GlobalGenerator;
  ppcVar44 = (pcVar35->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppcVar11 = (pcVar35->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppcVar44 != ppcVar11) {
    do {
      std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>>
                ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)&local_628,
                 pVStack_620,
                 ((*ppcVar44)->GeneratorTargets).
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 ((*ppcVar44)->GeneratorTargets).
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      ppcVar44 = ppcVar44 + 1;
    } while (ppcVar44 != ppcVar11);
  }
  pVVar39 = pVStack_620;
  VVar41 = local_628;
  if (local_628 != pVStack_620) {
    lVar48 = (long)pVStack_620 - (long)local_628;
    uVar34 = lVar48 >> 3;
    lVar40 = 0x3f;
    if (uVar34 != 0) {
      for (; uVar34 >> lVar40 == 0; lVar40 = lVar40 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
              (local_628.int_,pVStack_620,((uint)lVar40 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar48 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                (VVar41.int_,pVVar39);
    }
    else {
      pVVar28 = (ValueHolder *)(VVar41.int_ + 0x80);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                (VVar41.int_,pVVar28);
      for (; pVVar28 != pVVar39; pVVar28 = pVVar28 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                  (pVVar28);
      }
    }
  }
  local_650 = pVStack_620;
  if (local_628 != pVStack_620) {
    local_630 = (_Base_ptr)&this->TopBuild;
    local_638 = &this->DirectoryMap;
    local_600 = &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    VVar41 = local_628;
    do {
      VVar47.int_ = *VVar41.int_;
      TVar23 = cmGeneratorTarget::GetType((cmGeneratorTarget *)VVar47.map_);
      if ((TVar23 != GLOBAL_TARGET) &&
         (TVar23 = cmGeneratorTarget::GetType((cmGeneratorTarget *)VVar47.map_),
         TVar23 != INTERFACE_LIBRARY)) {
        AVar24 = Json::Value::size(&local_3f0);
        VStack_3c0 = (ValueHolder)this->Config;
        local_3c8 = VVar47;
        pcVar35 = cmGeneratorTarget::GetGlobalGenerator((cmGeneratorTarget *)VVar47.map_);
        psVar36 = cmake::GetHomeDirectory_abi_cxx11_(pcVar35->CMakeInstance);
        local_3b8._M_allocated_capacity = (size_type)local_3a8;
        pcVar12 = (psVar36->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3b8,pcVar12,pcVar12 + psVar36->_M_string_length);
        pcVar35 = cmGeneratorTarget::GetGlobalGenerator((cmGeneratorTarget *)VVar47.map_);
        psVar36 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar35->CMakeInstance);
        local_398[0] = local_388;
        pcVar12 = (psVar36->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_398,pcVar12,pcVar12 + psVar36->_M_string_length);
        std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                  (&local_378,
                   &(*(cmMakefile **)
                      (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&(local_3c8.map_)->_M_t)->_M_local_buf + 8))->SourceGroups);
        local_678.string_ = (char *)&local_668;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_678,local_3b8._M_allocated_capacity,
                   (char *)(local_3b8._8_8_ + local_3b8._M_allocated_capacity));
        local_360.string_ = (char *)&local_350;
        if (local_678 == &local_668) {
          uStack_348 = local_668._8_8_;
        }
        else {
          local_360.int_ = local_678.int_;
        }
        local_350.uint_ = local_668._M_allocated_capacity;
        local_358 = VStack_670;
        VStack_670.int_ = 0;
        local_668._M_allocated_capacity = local_668._M_allocated_capacity & 0xffffffffffffff00;
        local_340 = &p_Stack_310;
        local_338 = 1;
        local_330 = 0;
        uStack_328 = 0;
        local_320 = 0x3f800000;
        local_318 = 0;
        p_Stack_310 = (_Base_ptr)0x0;
        local_308 = &uStack_2d8;
        local_300 = 1;
        local_2f8 = 0;
        uStack_2f0 = 0;
        local_2e8 = 0x3f800000;
        local_2e0 = 0;
        uStack_2d8 = 0;
        local_2d0 = &p_Stack_2a0;
        local_2c8 = 1;
        local_2c0 = 0;
        uStack_2b8 = 0;
        local_2b0 = 0x3f800000;
        local_2a8 = 0;
        p_Stack_2a0 = (_Base_ptr)0x0;
        local_678.string_ = (char *)&local_668;
        Json::Value::Value(&local_298,arrayValue);
        Json::Value::Value(&local_270,arrayValue);
        Json::Value::Value(&local_248,arrayValue);
        if (local_678 != &local_668) {
          operator_delete(local_678.string_,(ulong)(local_668._M_allocated_capacity + 1));
        }
        local_218._M_color = _S_red;
        local_218._M_parent = (_Base_ptr)0x0;
        local_218._M_left = &local_218;
        local_1f8 = 0;
        local_1f0 = &p_Stack_1c0;
        local_1e8 = 1;
        local_1e0 = 0;
        uStack_1d8 = 0;
        local_1d0 = 0x3f800000;
        local_1c8 = 0;
        p_Stack_1c0 = (_Base_ptr)0x0;
        local_218._M_right = local_218._M_left;
        Json::Value::Value(&local_1b8,arrayValue);
        local_190 = &p_Stack_160;
        local_188 = 1;
        local_180 = 0;
        uStack_178 = 0;
        local_170 = 0x3f800000;
        local_138._M_color = _S_red;
        local_138._M_parent = (_Base_ptr)0x0;
        local_148 = 0;
        local_158 = 0;
        uStack_150 = 0;
        local_168 = 0;
        p_Stack_160 = (_Base_ptr)0x0;
        local_138._M_left = &local_138;
        local_108 = 0;
        uStack_100 = 0;
        local_118 = 0;
        uStack_110 = 0;
        local_138._M_right = local_138._M_left;
        psVar36 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)VVar47.map_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4f0,"target-",psVar36);
        if (this->Config->_M_string_length != 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_678,"-",this->Config);
          std::__cxx11::string::_M_append((char *)&local_4f0[0].int_,local_678.uint_);
          if (local_678 != &local_668) {
            operator_delete(local_678.string_,(ulong)(local_668._M_allocated_capacity + 1));
          }
        }
        this_00 = this->FileAPI;
        Target::Dump((Value *)&local_678,(Target *)&local_3c8);
        cmFileAPI::MaybeJsonFile(&local_438,this_00,(Value *)&local_678,(string *)local_4f0);
        Json::Value::~Value((Value *)&local_678);
        psVar36 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)VVar47.map_);
        Json::Value::Value((Value *)&local_5f8,psVar36);
        pVVar25 = Json::Value::operator[](&local_438,"name");
        Json::Value::operator=(pVVar25,(Value *)&local_5f8);
        Json::Value::~Value((Value *)&local_5f8);
        TargetId((string *)&local_5c8,(cmGeneratorTarget *)VVar47.map_,(string *)local_630);
        Json::Value::Value((Value *)&local_488,(string *)&local_5c8);
        pVVar25 = Json::Value::operator[](&local_438,"id");
        Json::Value::operator=(pVVar25,(Value *)&local_488);
        Json::Value::~Value((Value *)&local_488);
        if (local_5c8 != local_5b8) {
          operator_delete(local_5c8.string_,(ulong)(local_5b8[0].comment_ + 1));
        }
        pcVar37 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)VVar47.map_);
        cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_560,pcVar37);
        cmStateSnapshot::GetBuildsystemDirectory
                  ((cmStateSnapshot *)&local_588,(cmStateSnapshot *)&local_560);
        local_5b8[0].comment_ = local_578;
        local_5c8 = local_588;
        uStack_5c0 = uStack_580;
        iVar31 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(&local_638->_M_t,(key_type *)&local_5c8);
        if (iVar31._M_node == local_600) goto LAB_002a14a0;
        uVar7 = *(uint *)&iVar31._M_node[1]._M_right;
        Json::Value::Value((Value *)&local_5c8,uVar7);
        pVVar25 = Json::Value::operator[](&local_438,"directoryIndex");
        Json::Value::operator=(pVVar25,(Value *)&local_5c8);
        Json::Value::~Value((Value *)&local_5c8);
        pDVar43 = (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&local_588,AVar24);
        Json::Value::append(&pDVar43[uVar7].TargetIndexes,(Value *)&local_588);
        Json::Value::~Value((Value *)&local_588);
        uVar7 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar7].ProjectIndex;
        Json::Value::Value((Value *)&local_588,uVar7);
        pVVar25 = Json::Value::operator[](&local_438,"projectIndex");
        Json::Value::operator=(pVVar25,(Value *)&local_588);
        Json::Value::~Value((Value *)&local_588);
        pPVar38 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&local_560,AVar24);
        Json::Value::append(&pPVar38[uVar7].TargetIndexes,(Value *)&local_560);
        Json::Value::~Value((Value *)&local_560);
        if (local_4f0[0] != &local_4e0) {
          operator_delete(local_4f0[0].string_,local_4e0._M_allocated_capacity + 1);
        }
        Target::~Target((Target *)&local_3c8);
        Json::Value::append(&local_3f0,&local_438);
        Json::Value::~Value(&local_438);
      }
      VVar41.string_ = (char *)((ValueHolder *)&(VVar41.map_)->_M_t + 1);
    } while ((ValueHolder *)VVar41.int_ != local_650);
  }
  if (local_628 != (ValueHolder *)0x0) {
    operator_delete(local_628.string_,local_618 - (long)local_628);
  }
  pVVar25 = Json::Value::operator[](local_648,"targets");
  Json::Value::operator=(pVVar25,&local_3f0);
  Json::Value::~Value(&local_3f0);
  Json::Value::Value(&local_d0,arrayValue);
  pVVar39 = (ValueHolder *)
            (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_650 = (ValueHolder *)
              (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar39 != local_650) {
    local_630 = (_Base_ptr)&this->TopBuild;
    p_Var1 = &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header;
    do {
      Json::Value::Value(&local_518,objectValue);
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_3c8,(cmStateSnapshot *)pVVar39);
      psVar36 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&local_3c8);
      local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
      pcVar12 = (psVar36->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_538,pcVar12,pcVar12 + psVar36->_M_string_length);
      RelativeIfUnder((string *)&local_3c8,&this->TopSource,&local_538);
      Json::Value::Value((Value *)&local_5f8,(string *)&local_3c8);
      pVVar25 = Json::Value::operator[](&local_518,"source");
      Json::Value::operator=(pVVar25,(Value *)&local_5f8);
      Json::Value::~Value((Value *)&local_5f8);
      if (local_3c8 != &local_3b8) {
        operator_delete(local_3c8.string_,(ulong)(local_3b8._M_allocated_capacity + 1));
      }
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_3c8,(cmStateSnapshot *)pVVar39);
      psVar36 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&local_3c8);
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      pcVar12 = (psVar36->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4a8,pcVar12,pcVar12 + psVar36->_M_string_length);
      RelativeIfUnder((string *)&local_3c8,(string *)local_630,&local_4a8);
      Json::Value::Value((Value *)&local_488,(string *)&local_3c8);
      pVVar25 = Json::Value::operator[](&local_518,"build");
      Json::Value::operator=(pVVar25,(Value *)&local_488);
      Json::Value::~Value((Value *)&local_488);
      if (local_3c8 != &local_3b8) {
        operator_delete(local_3c8.string_,(ulong)(local_3b8._M_allocated_capacity + 1));
      }
      cmStateSnapshot::GetBuildsystemDirectoryParent
                ((cmStateSnapshot *)&local_70,(cmStateSnapshot *)pVVar39);
      bVar21 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_70);
      if (bVar21) {
        local_3b8._M_allocated_capacity = (size_type)local_60;
        local_3c8 = local_70;
        VStack_3c0 = VStack_68;
        iVar31 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_3c8);
        if ((_Rb_tree_header *)iVar31._M_node == p_Var1) {
LAB_002a14a0:
          __assert_fail("i != this->DirectoryMap.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileAPICodemodel.cxx"
                        ,0x1bd,
                        "Json::ArrayIndex (anonymous namespace)::CodemodelConfig::GetDirectoryIndex(cmStateSnapshot)"
                       );
        }
        Json::Value::Value((Value *)&local_5c8,*(UInt *)&iVar31._M_node[1]._M_right);
        pVVar25 = Json::Value::operator[](&local_518,"parentIndex");
        Json::Value::operator=(pVVar25,(Value *)&local_5c8);
        Json::Value::~Value((Value *)&local_5c8);
      }
      Json::Value::Value((Value *)&local_588,arrayValue);
      cmStateSnapshot::GetChildren
                ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_560,
                 (cmStateSnapshot *)pVVar39);
      pcVar5 = local_558;
      for (VVar41 = local_560; VVar41 != pcVar5;
          VVar41.string_ =
               (char *)&((VVar41.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
        cmStateSnapshot::GetBuildsystemDirectory
                  ((cmStateSnapshot *)&local_88,(cmStateSnapshot *)VVar41.map_);
        local_668._M_allocated_capacity = (size_type)local_78;
        local_678 = local_88;
        VStack_670 = VStack_80;
        iVar31 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_678);
        if ((_Rb_tree_header *)iVar31._M_node == p_Var1) goto LAB_002a14a0;
        Json::Value::Value((Value *)&local_3c8,*(UInt *)&iVar31._M_node[1]._M_right);
        Json::Value::append((Value *)&local_588,(Value *)&local_3c8);
        Json::Value::~Value((Value *)&local_3c8);
      }
      if (local_560 != (cmStateSnapshot *)0x0) {
        operator_delete(local_560.string_,local_550 - (long)local_560);
      }
      bVar21 = Json::Value::empty((Value *)&local_588);
      if (!bVar21) {
        Json::Value::Value((Value *)&local_560,(Value *)&local_588);
        pVVar25 = Json::Value::operator[](&local_518,"childIndexes");
        Json::Value::operator=(pVVar25,(Value *)&local_560);
        Json::Value::~Value((Value *)&local_560);
      }
      Json::Value::Value(&local_438,*(UInt *)(pVVar39 + 9));
      pVVar25 = Json::Value::operator[](&local_518,"projectIndex");
      Json::Value::operator=(pVVar25,&local_438);
      Json::Value::~Value(&local_438);
      bVar21 = Json::Value::empty((Value *)(pVVar39 + 4));
      if (!bVar21) {
        Json::Value::Value((Value *)local_4f0,(Value *)(pVVar39 + 4));
        pVVar25 = Json::Value::operator[](&local_518,"targetIndexes");
        Json::Value::operator=(pVVar25,(Value *)local_4f0);
        Json::Value::~Value((Value *)local_4f0);
      }
      local_98 = pVVar39[2];
      local_a8 = *pVVar39;
      VStack_a0 = pVVar39[1];
      Json::Value::Value((Value *)&local_628,nullValue);
      local_3c8.string_ = (char *)&local_3b8;
      local_678.int_ = 0x1e;
      local_3c8.int_ = std::__cxx11::string::_M_create(&local_3c8.uint_,(ulong)&local_678);
      local_3b8._M_allocated_capacity = (size_type)local_678;
      (((_Rep_type *)local_3c8)->_M_impl).super__Rb_tree_header._M_header.field_0x6 = 'R';
      (((_Rep_type *)local_3c8)->_M_impl).super__Rb_tree_header._M_header.field_0x7 = 'E';
      *(char *)&(((_Rep_type *)local_3c8)->_M_impl).super__Rb_tree_header._M_header._M_parent = 'Q';
      *(char *)((long)&(((_Rep_type *)local_3c8)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 1) = 'U';
      *(char *)((long)&(((_Rep_type *)local_3c8)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 2) = 'I';
      *(char *)((long)&(((_Rep_type *)local_3c8)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 3) = 'R';
      *(char *)((long)&(((_Rep_type *)local_3c8)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 4) = 'E';
      *(char *)((long)&(((_Rep_type *)local_3c8)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 5) = 'D';
      builtin_strncpy((char *)((long)&(local_3c8.map_)->_M_t + 0x16),"_VERSION",8);
      builtin_strncpy((char *)local_3c8,"CMAKE_MI",8);
      *(undefined8 *)
       (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&(local_3c8.map_)->_M_t)->_M_local_buf + 8) = 0x45525f4d554d494e;
      VStack_3c0.int_ = local_678.int_;
      local_3c8.string_[local_678.string_] = '\0';
      psVar36 = cmStateSnapshot::GetDefinition((cmStateSnapshot *)&local_a8,(string *)&local_3c8);
      if (local_3c8 != &local_3b8) {
        operator_delete(local_3c8.string_,(ulong)(local_3b8._M_allocated_capacity + 1));
      }
      if (psVar36 != (string *)0x0) {
        Json::Value::Value((Value *)&local_3c8,objectValue);
        Json::Value::operator=((Value *)&local_628,(Value *)&local_3c8);
        Json::Value::~Value((Value *)&local_3c8);
        Json::Value::Value((Value *)&local_678,psVar36);
        pVVar25 = Json::Value::operator[]((Value *)&local_628,"string");
        Json::Value::operator=(pVVar25,(Value *)&local_678);
        Json::Value::~Value((Value *)&local_678);
      }
      bVar21 = Json::Value::isNull((Value *)&local_628);
      if (!bVar21) {
        Json::Value::Value((Value *)&local_3c8,(Value *)&local_628);
        pVVar25 = Json::Value::operator[](&local_518,"minimumCMakeVersion");
        Json::Value::operator=(pVVar25,(Value *)&local_3c8);
        Json::Value::~Value((Value *)&local_3c8);
      }
      if (*(char *)((long)pVVar39 + 0x4c) == '\x01') {
        Json::Value::Value((Value *)&local_678,true);
        pVVar25 = Json::Value::operator[](&local_518,"hasInstallRule");
        Json::Value::operator=(pVVar25,(Value *)&local_678);
        Json::Value::~Value((Value *)&local_678);
      }
      Json::Value::~Value((Value *)&local_628);
      Json::Value::~Value((Value *)&local_588);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_dataplus._M_p != &local_538.field_2) {
        operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
      }
      Json::Value::append(&local_d0,&local_518);
      Json::Value::~Value(&local_518);
      pVVar39 = pVVar39 + 10;
    } while (pVVar39 != local_650);
  }
  pVVar25 = Json::Value::operator[](local_648,"directories");
  Json::Value::operator=(pVVar25,&local_d0);
  Json::Value::~Value(&local_d0);
  Json::Value::Value(&local_f8,arrayValue);
  pPVar38 = (this->Projects).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar13 = (this->Projects).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar38 != pPVar13) {
    do {
      Json::Value::Value((Value *)&local_588,objectValue);
      cmStateSnapshot::GetProjectName_abi_cxx11_((string *)&local_678,&pPVar38->Snapshot);
      Json::Value::Value((Value *)&local_3c8,(string *)&local_678);
      pVVar25 = Json::Value::operator[]((Value *)&local_588,"name");
      Json::Value::operator=(pVVar25,(Value *)&local_3c8);
      Json::Value::~Value((Value *)&local_3c8);
      if (local_678 != &local_668) {
        operator_delete(local_678.string_,(ulong)(local_668._M_allocated_capacity + 1));
      }
      if (pPVar38->ParentIndex != 0xffffffff) {
        Json::Value::Value((Value *)&local_678,pPVar38->ParentIndex);
        pVVar25 = Json::Value::operator[]((Value *)&local_588,"parentIndex");
        Json::Value::operator=(pVVar25,(Value *)&local_678);
        Json::Value::~Value((Value *)&local_678);
      }
      bVar21 = Json::Value::empty(&pPVar38->ChildIndexes);
      if (!bVar21) {
        Json::Value::Value((Value *)&local_5f8,&pPVar38->ChildIndexes);
        pVVar25 = Json::Value::operator[]((Value *)&local_588,"childIndexes");
        Json::Value::operator=(pVVar25,(Value *)&local_5f8);
        Json::Value::~Value((Value *)&local_5f8);
      }
      Json::Value::Value((Value *)&local_488,&pPVar38->DirectoryIndexes);
      pVVar25 = Json::Value::operator[]((Value *)&local_588,"directoryIndexes");
      Json::Value::operator=(pVVar25,(Value *)&local_488);
      Json::Value::~Value((Value *)&local_488);
      bVar21 = Json::Value::empty(&pPVar38->TargetIndexes);
      if (!bVar21) {
        Json::Value::Value((Value *)&local_5c8,&pPVar38->TargetIndexes);
        pVVar25 = Json::Value::operator[]((Value *)&local_588,"targetIndexes");
        Json::Value::operator=(pVVar25,(Value *)&local_5c8);
        Json::Value::~Value((Value *)&local_5c8);
      }
      Json::Value::append(&local_f8,(Value *)&local_588);
      Json::Value::~Value((Value *)&local_588);
      pPVar38 = pPVar38 + 1;
    } while (pPVar38 != pPVar13);
  }
  pVVar25 = Json::Value::operator[](local_648,"projects");
  Json::Value::operator=(pVVar25,&local_f8);
  Json::Value::~Value(&local_f8);
  return local_648;
}

Assistant:

Json::Value CodemodelConfig::Dump()
{
  Json::Value configuration = Json::objectValue;
  configuration["name"] = this->Config;
  this->ProcessDirectories();
  configuration["targets"] = this->DumpTargets();
  configuration["directories"] = this->DumpDirectories();
  configuration["projects"] = this->DumpProjects();
  return configuration;
}